

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::block_move
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool param_1_local;
  AccessType param_0_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchBlockX);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleStoreBlockY);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchBlockY);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchBlockY);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  return;
}

Assistant:

static void block_move(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);	// DBA.
		target(CycleFetchIncrementPC);	// SBA.

		target(CycleFetchBlockX);		// SRC Data.
		target(CycleStoreBlockY);		// Dest Data.

		target(CycleFetchBlockY);		// IO.
		target(CycleFetchBlockY);		// IO.

		target(OperationPerform);		// [MVN or MVP]
	}